

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O0

int mk_plugin_http_request_end(mk_plugin *plugin,mk_http_session *cs,int close)

{
  mk_server *server_00;
  mk_sched_conn *conn;
  int iVar1;
  mk_sched_worker *sched;
  mk_list *__mptr;
  mk_server *server;
  mk_http_request *sr;
  int con;
  int ret;
  int close_local;
  mk_http_session *cs_local;
  mk_plugin *plugin_local;
  
  server_00 = plugin->server_ctx;
  cs->status = -1;
  iVar1 = mk_list_is_empty(&cs->request_list);
  if (iVar1 == 0) {
    plugin_local._4_4_ = -1;
  }
  else {
    mk_plugin_stage_run_40(cs,(mk_http_request *)&(cs->request_list).prev[-0x3f].next,server_00);
    if (close == 1) {
      cs->close_now = 1;
    }
    plugin_local._4_4_ = mk_http_request_end(cs,server_00);
    if (plugin_local._4_4_ < 0) {
      conn = cs->conn;
      sched = mk_sched_get_thread_conf();
      plugin_local._4_4_ = mk_sched_event_close(conn,sched,3,server_00);
      if (plugin_local._4_4_ == 0) {
        plugin_local._4_4_ = -1;
      }
    }
  }
  return plugin_local._4_4_;
}

Assistant:

int mk_plugin_http_request_end(struct mk_plugin *plugin,
                               struct mk_http_session *cs, int close)
{
    int ret;
    int con;
    struct mk_http_request *sr;
    struct mk_server *server = plugin->server_ctx;

    MK_TRACE("[FD %i] PLUGIN HTTP REQUEST END", cs->socket);

    cs->status = MK_REQUEST_STATUS_INCOMPLETE;
    if (mk_list_is_empty(&cs->request_list) == 0) {
        MK_TRACE("[FD %i] Tried to end non-existing request.", cs->socket);
        return -1;
    }

    sr = mk_list_entry_last(&cs->request_list, struct mk_http_request, _head);
    mk_plugin_stage_run_40(cs, sr, server);

    if (close == MK_TRUE) {
        cs->close_now = MK_TRUE;
    }

    /* Let's check if we should ask to finalize the connection or not */
    ret = mk_http_request_end(cs, server);
    MK_TRACE("[FD %i] HTTP session end = %i", cs->socket, ret);
    if (ret < 0) {
        con = mk_sched_event_close(cs->conn, mk_sched_get_thread_conf(),
                                   MK_EP_SOCKET_DONE, server);
        if (con != 0) {
            return con;
        }
        else {
            return -1;
        }
    }

    return ret;
}